

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O0

char * yyqq(char *s)

{
  int iVar1;
  char *pcVar2;
  int local_30;
  int local_2c;
  int dl;
  int sl;
  char *dst;
  char *d;
  char *s_local;
  
  local_2c = 0;
  local_30 = 0;
  iVar1 = local_30;
  d = s;
  while (local_30 = iVar1, pcVar2 = d + 1, *d != '\0') {
    local_2c = local_2c + 1;
    d = pcVar2;
    if ((((((*pcVar2 == '\a') || (*pcVar2 == '\b')) || (*pcVar2 == '\t')) ||
         ((*pcVar2 == '\v' || (*pcVar2 == '\f')))) ||
        ((*pcVar2 == '\r' || ((*pcVar2 == '\x1b' || (*pcVar2 == '\"')))))) ||
       ((*pcVar2 == '%' || (*pcVar2 == '\\')))) {
      iVar1 = local_30 + 2;
    }
    else if (*pcVar2 == '\n') {
      iVar1 = local_30 + 4;
    }
    else {
      iVar1 = local_30 + 1;
      if (*pcVar2 < ' ') {
        iVar1 = local_30 + 5;
      }
    }
  }
  s_local = s;
  if (local_30 != local_2c) {
    s_local = (char *)malloc((long)(local_30 + 1));
    dst = s_local;
    for (d = s; *d != '\0'; d = d + 1) {
      if (*d == '\"') {
        *dst = '\\';
        dst[1] = *d;
        dst = dst + 2;
      }
      else if (*d == '%') {
        *dst = '%';
        dst[1] = *d;
        dst = dst + 2;
      }
      else if (*d == '\n') {
        builtin_strncpy(dst,"\\n\\\n",4);
        dst = dst + 4;
      }
      else if (*d == '\t') {
        *dst = '\\';
        dst[1] = 't';
        dst = dst + 2;
      }
      else if (*d == '\r') {
        *dst = '\\';
        dst[1] = 'r';
        dst = dst + 2;
      }
      else if (*d == '\a') {
        *dst = '\\';
        dst[1] = 'a';
        dst = dst + 2;
      }
      else if (*d == '\b') {
        *dst = '\\';
        dst[1] = 'b';
        dst = dst + 2;
      }
      else if (*d == '\x1b') {
        *dst = '\\';
        dst[1] = 'e';
        dst = dst + 2;
      }
      else if (*d == '\f') {
        *dst = '\\';
        dst[1] = 'f';
        dst = dst + 2;
      }
      else if (*d == '\v') {
        *dst = '\\';
        dst[1] = 'v';
        dst = dst + 2;
      }
      else if (*d == '\\') {
        *dst = '\\';
        dst[1] = *d;
        dst = dst + 2;
      }
      else if (*d < ' ') {
        sprintf(dst,"\\%03o",(ulong)(uint)(int)*d);
        dst = dst + 4;
      }
      else {
        *dst = *d;
        dst = dst + 1;
      }
    }
    *dst = '\0';
  }
  return s_local;
}

Assistant:

static char *yyqq(char* s) {
  char *d = s;
  char *dst;
  int sl = 0, dl = 0;
  while (*s++) {
    dl++; sl++;
    if (*s==7||*s==8||*s==9||*s==11||*s==12||*s==13||*s==27||*s==34||*s=='%'||*s==92) { dl++; } /* escape with '\' */
    else if (*s==10) { dl += 3; }        /* \n\^J */
    else if (*(signed char*)s<32) { dl += 4; } /* octal \000 */
  }
  if (dl == sl) return d;
  s = d;
  dst = d = (char *)malloc(dl+1);
  while (*s) {
    if (*s == '"') {
      *d++ = '\\'; *d++ = *s++;
    } else if (*s == '%') { /* '%' in printf */
      *d++ = '%'; *d++ = *s++;
    } else if (*s == '\n') { /* \n\^J */
      *d++ = '\\'; *d++ = 'n'; *d++ = '\\'; *d++ = 10; s++;
    } else if (*s == '\t') { /* ht */
      *d++ = '\\'; *d++ = 't'; s++;
    } else if (*s == '\r') { /*cr */
      *d++ = '\\'; *d++ = 'r'; s++;
    } else if (*s == '\a') { /*bel*/
      *d++ = '\\'; *d++ = 'a'; s++;
    } else if (*s == '\b') { /*bs*/
      *d++ = '\\'; *d++ = 'b'; s++;
    } else if (*s == '\e') { /*esc*/
      *d++ = '\\'; *d++ = 'e'; s++;
    } else if (*s == '\f') { /*ff*/
      *d++ = '\\'; *d++ = 'f'; s++;
    } else if (*s == '\v') { /*vt*/
      *d++ = '\\'; *d++ = 'v'; s++;
    } else if (*s == 92) { /* '\' */
      *d++ = '\\'; *d++ = *s++;
    } else if (*(signed char*)s<32) {
      sprintf(d,"\\%03o", *s); /* octal \000 */
      d += 4; s++;
    } else {
      *d++ = *s++;
    }
  }
  *d = 0;
  return dst;
}